

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::~MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  void *pvVar1;
  long in_RDI;
  CrtAllocator *a;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    if (*(ulong *)(*(long *)(in_RDI + 0x10) + 0x10) < 2) {
      Clear(in_stack_ffffffffffffffe0);
      pvVar1 = *(void **)(*(long *)(in_RDI + 0x10) + 8);
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x18) & 1) != 0) {
        CrtAllocator::Free((void *)0x3d4d37);
      }
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,1);
      }
    }
    else {
      *(long *)(*(long *)(in_RDI + 0x10) + 0x10) = *(long *)(*(long *)(in_RDI + 0x10) + 0x10) + -1;
    }
  }
  return;
}

Assistant:

~MemoryPoolAllocator() RAPIDJSON_NOEXCEPT {
        if (!shared_) {
            // do nothing if moved
            return;
        }
        if (shared_->refcount > 1) {
            --shared_->refcount;
            return;
        }
        Clear();
        BaseAllocator *a = shared_->ownBaseAllocator;
        if (shared_->ownBuffer) {
            baseAllocator_->Free(shared_);
        }
        RAPIDJSON_DELETE(a);
    }